

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O3

void vkt::ubo::anon_unknown_0::generateDeclaration
               (ostringstream *src,int blockNdx,UniformBlock *block,UniformLayout *layout,
               bool shuffleUniformMembers)

{
  deUint32 flagsMask;
  LayoutFlagsFmt LVar1;
  Uniform *name_00;
  pointer pSVar2;
  uint uVar3;
  Type TVar4;
  ostream *poVar5;
  Uniform **ppUVar6;
  VarType *pVVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  __normal_iterator<const_vkt::ubo::Uniform_*,_std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>_>
  it;
  LayoutFlagsFmt LVar11;
  Traverser<const_vkt::ubo::Uniform> uniforms;
  ostringstream name;
  vector<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_> local_1f8;
  Uniform **ppUStack_1e0;
  int local_1d4;
  UniformLayout *local_1d0;
  string local_1c8;
  vector<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_> local_1a8 [4];
  ios_base local_138 [264];
  
  local_1d0 = layout;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)src,"layout(set = 0, binding = ",0x1a);
  local_1d4 = blockNdx;
  std::ostream::operator<<(src,blockNdx);
  if ((block->m_flags & 0x1f8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,", ",2);
    local_1a8[0].
    super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)(block->m_flags & 0x1f8);
    operator<<((ostream *)src,(LayoutFlagsFmt *)local_1a8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)src,(block->m_blockName)._M_dataplus._M_p,
             (block->m_blockName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\n{\n",3);
  LVar11 = (LayoutFlagsFmt)
           (block->m_uniforms).
           super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>._M_impl.
           super__Vector_impl_data._M_start;
  LVar1 = (LayoutFlagsFmt)
          (block->m_uniforms).
          super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>._M_impl.
          super__Vector_impl_data._M_finish;
  local_1f8.
  super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Uniform **)0x0;
  ppUStack_1e0 = (Uniform **)0x0;
  local_1f8.
  super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>._M_impl.
  super__Vector_impl_data._M_start = (Uniform **)0x0;
  local_1f8.
  super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Uniform **)0x0;
  if (LVar11 != LVar1) {
    do {
      local_1a8[0].
      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)LVar11;
      std::vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>>::
      emplace_back<vkt::ubo::Uniform_const*>
                ((vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>> *)
                 &local_1f8,(Uniform **)local_1a8);
      LVar11 = (LayoutFlagsFmt)((long)LVar11 + 0x40);
    } while (LVar11 != LVar1);
  }
  if (shuffleUniformMembers) {
    std::vector<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>::vector
              (local_1a8,&local_1f8);
    uVar10 = (ulong)((long)local_1a8[0].
                           super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1a8[0].
                          super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
    if (local_1f8.
        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_1f8.
        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_1f8.
      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_1f8.
           super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    if ((int)uVar10 != 0) {
      iVar8 = -1;
      do {
        uVar9 = (uint)uVar10;
        iVar8 = iVar8 + uVar9;
        ppUVar6 = (Uniform **)
                  ((long)iVar8 * 8 +
                  (long)local_1a8[0].
                        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        if (local_1f8.
            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1f8.
            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>>::
          _M_realloc_insert<vkt::ubo::Uniform_const*const&>
                    ((vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>> *)
                     &local_1f8,
                     (iterator)
                     local_1f8.
                     super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,ppUVar6);
        }
        else {
          *local_1f8.
           super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = *ppUVar6;
          local_1f8.
          super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_1f8.
               super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = ~uVar9;
        if (0 < (int)uVar9) {
          uVar3 = 1 - uVar9;
        }
        uVar10 = (ulong)uVar3;
      } while (uVar3 != 0);
    }
    if ((LayoutFlagsFmt)
        local_1a8[0].
        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (LayoutFlagsFmt)0x0) {
      operator_delete(local_1a8[0].
                      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8[0].
                            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8[0].
                            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  ppUStack_1e0 = local_1f8.
                 super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
LAB_00673036:
  if (ppUStack_1e0 !=
      local_1f8.
      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppUVar6 = ppUStack_1e0 + 1;
    name_00 = *ppUStack_1e0;
    ppUStack_1e0 = ppUVar6;
    if (name_00 != (Uniform *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\t",1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if ((block->m_instanceName)._M_string_length != 0) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(block->m_blockName)._M_dataplus._M_p,
                            (block->m_blockName)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(name_00->m_name)._M_dataplus._M_p,
                 (name_00->m_name)._M_string_length);
      pVVar7 = &name_00->m_type;
LAB_006730bd:
      TVar4 = pVVar7->m_type;
      if (TVar4 == TYPE_ARRAY) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[0]",3);
        pVVar7 = (pVVar7->m_data).array.elementType;
        TVar4 = pVVar7->m_type;
      }
      else if (TVar4 == TYPE_BASIC) goto LAB_00673112;
      if (TVar4 == TYPE_STRUCT) {
        pSVar2 = (((pVVar7->m_data).structPtr)->m_members).
                 super__Vector_base<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pSVar2->m_name)._M_dataplus._M_p,
                   (pSVar2->m_name)._M_string_length);
        pVVar7 = &pSVar2->m_type;
      }
      goto LAB_006730bd;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"}",1);
  if ((block->m_instanceName)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)src,(block->m_instanceName)._M_dataplus._M_p,
               (block->m_instanceName)._M_string_length);
    if (0 < block->m_arraySize) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"[",1);
      poVar5 = (ostream *)std::ostream::operator<<(src,block->m_arraySize);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,";\n",2);
  if (local_1f8.
      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (Uniform **)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
LAB_00673112:
  std::__cxx11::stringbuf::str();
  iVar8 = UniformLayout::getUniformLayoutIndex(local_1d0,local_1d4,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  flagsMask = (local_1d0->uniforms).
              super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar8].offset;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar9 = name_00->m_flags;
  if ((uVar9 & 0x1f8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"layout(",7);
    local_1a8[0].
    super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)(name_00->m_flags & 0x1f8);
    operator<<((ostream *)src,(LayoutFlagsFmt *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,") ",2);
    uVar9 = name_00->m_flags;
  }
  generateDeclaration(src,&name_00->m_type,&name_00->m_name,uVar9 & 0x1800,0xffffffff,flagsMask,
                      (deUint32)block);
  goto LAB_00673036;
}

Assistant:

void generateDeclaration (std::ostringstream& src, int blockNdx, const UniformBlock& block, const UniformLayout& layout, bool shuffleUniformMembers)
{
	src << "layout(set = 0, binding = " << blockNdx;
	if ((block.getFlags() & LAYOUT_MASK) != 0)
		src << ", " << LayoutFlagsFmt(block.getFlags() & LAYOUT_MASK);
	src << ") ";

	src << "uniform " << block.getBlockName();
	src << "\n{\n";

	Traverser<const Uniform> uniforms(block.begin(), block.end(), shuffleUniformMembers);

	while (const Uniform* pUniform = uniforms.next())
	{
		src << Indent(1);
		generateDeclaration(src, *pUniform, 1 /* indent level */, getBlockMemberOffset(blockNdx, block, *pUniform, layout));
	}

	src << "}";

	if (block.hasInstanceName())
	{
		src << " " << block.getInstanceName();
		if (block.isArray())
			src << "[" << block.getArraySize() << "]";
	}
	else
		DE_ASSERT(!block.isArray());

	src << ";\n";
}